

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

Status __thiscall leveldb::DBImpl::Get(DBImpl *this,ReadOptions *options,Slice *key,string *value)

{
  long lVar1;
  undefined1 uVar2;
  bool bVar3;
  LookupKey *k;
  Version *this_00;
  long in_RDX;
  LookupKey *in_RSI;
  Slice *in_RDI;
  long in_FS_OFFSET;
  bool have_stat_update;
  Version *current;
  MemTable *imm;
  MemTable *mem;
  SequenceNumber snapshot;
  Status *s;
  GetStats stats;
  MutexLock l;
  LookupKey lkey;
  DBImpl *in_stack_fffffffffffffe48;
  Status *in_stack_fffffffffffffe50;
  undefined5 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5d;
  undefined1 in_stack_fffffffffffffe5e;
  Slice *user_key;
  undefined7 in_stack_fffffffffffffe90;
  byte bVar4;
  Version *value_00;
  LookupKey *key_00;
  MemTable *this_01;
  ReadOptions *in_stack_fffffffffffffeb8;
  Version *in_stack_fffffffffffffec0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  user_key = in_RDI;
  Status::Status((Status *)in_stack_fffffffffffffe48);
  MutexLock::MutexLock((MutexLock *)in_stack_fffffffffffffe48,(Mutex *)0x18906c4);
  if (*(long *)(in_RDX + 8) == 0) {
    k = (LookupKey *)VersionSet::LastSequence((VersionSet *)in_stack_fffffffffffffe48);
  }
  else {
    k = (LookupKey *)SnapshotImpl::sequence_number((SnapshotImpl *)in_stack_fffffffffffffe48);
  }
  this_01 = *(MemTable **)(in_RSI[1].space_ + 0x38);
  key_00 = *(LookupKey **)(in_RSI[1].space_ + 0x40);
  this_00 = VersionSet::current((VersionSet *)in_stack_fffffffffffffe48);
  value_00 = this_00;
  MemTable::Ref((MemTable *)in_stack_fffffffffffffe48);
  if (key_00 != (LookupKey *)0x0) {
    MemTable::Ref((MemTable *)in_stack_fffffffffffffe48);
  }
  Version::Ref((Version *)in_stack_fffffffffffffe48);
  bVar4 = 0;
  port::Mutex::Unlock((Mutex *)in_stack_fffffffffffffe48);
  LookupKey::LookupKey(in_RSI,user_key,(SequenceNumber)in_RDI);
  uVar2 = MemTable::Get(this_01,key_00,(string *)value_00,
                        (Status *)CONCAT17(bVar4,in_stack_fffffffffffffe90));
  if ((!(bool)uVar2) &&
     ((key_00 == (LookupKey *)0x0 ||
      (in_stack_fffffffffffffe5e =
            MemTable::Get(this_01,key_00,(string *)value_00,
                          (Status *)CONCAT17(bVar4,in_stack_fffffffffffffe90)),
      !(bool)in_stack_fffffffffffffe5e)))) {
    Version::Get(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,k,(string *)this_01,
                 (GetStats *)key_00);
    Status::operator=((Status *)
                      CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffe5e,
                                              CONCAT15(in_stack_fffffffffffffe5d,
                                                       in_stack_fffffffffffffe58))),
                      in_stack_fffffffffffffe50);
    Status::~Status((Status *)in_stack_fffffffffffffe48);
    bVar4 = 1;
  }
  port::Mutex::Lock((Mutex *)in_stack_fffffffffffffe48);
  LookupKey::~LookupKey
            ((LookupKey *)
             CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffe5e,
                                     CONCAT15(in_stack_fffffffffffffe5d,in_stack_fffffffffffffe58)))
            );
  if (((bVar4 & 1) != 0) &&
     (bVar3 = Version::UpdateStats
                        (this_00,(GetStats *)
                                 CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffe5e,
                                                         CONCAT15(in_stack_fffffffffffffe5d,
                                                                  in_stack_fffffffffffffe58)))),
     bVar3)) {
    MaybeScheduleCompaction(in_stack_fffffffffffffe48);
  }
  MemTable::Unref((MemTable *)in_stack_fffffffffffffe48);
  if (key_00 != (LookupKey *)0x0) {
    MemTable::Unref((MemTable *)in_stack_fffffffffffffe48);
  }
  Version::Unref((Version *)in_stack_fffffffffffffe48);
  MutexLock::~MutexLock((MutexLock *)in_stack_fffffffffffffe48);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (Status)(char *)user_key;
  }
  __stack_chk_fail();
}

Assistant:

Status DBImpl::Get(const ReadOptions& options, const Slice& key,
                   std::string* value) {
  Status s;
  MutexLock l(&mutex_);
  SequenceNumber snapshot;
  if (options.snapshot != nullptr) {
    snapshot =
        static_cast<const SnapshotImpl*>(options.snapshot)->sequence_number();
  } else {
    snapshot = versions_->LastSequence();
  }

  MemTable* mem = mem_;
  MemTable* imm = imm_;
  Version* current = versions_->current();
  mem->Ref();
  if (imm != nullptr) imm->Ref();
  current->Ref();

  bool have_stat_update = false;
  Version::GetStats stats;

  // Unlock while reading from files and memtables
  {
    mutex_.Unlock();
    // First look in the memtable, then in the immutable memtable (if any).
    LookupKey lkey(key, snapshot);
    if (mem->Get(lkey, value, &s)) {
      // Done
    } else if (imm != nullptr && imm->Get(lkey, value, &s)) {
      // Done
    } else {
      s = current->Get(options, lkey, value, &stats);
      have_stat_update = true;
    }
    mutex_.Lock();
  }

  if (have_stat_update && current->UpdateStats(stats)) {
    MaybeScheduleCompaction();
  }
  mem->Unref();
  if (imm != nullptr) imm->Unref();
  current->Unref();
  return s;
}